

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

ssize_t __thiscall
QXmlStreamWriterPrivate::write(QXmlStreamWriterPrivate *this,int __fd,void *__buf,size_t __n)

{
  QString *pQVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QUtf8StringView str_00;
  QLatin1StringView s;
  QUtf8StringView s_00;
  QMessageLogger local_28;
  long local_8;
  
  str_00.m_data = (char *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->device == (QIODevice *)0x0) {
    pQVar1 = this->stringDevice;
    if (pQVar1 != (QString *)0x0) {
      str_00.m_size = (ulong)__buf & 0x3fffffffffffffff;
      if (((ulong)__buf & 0xc000000000000000) == 0x4000000000000000) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          str.m_data = str_00.m_data;
          str.m_size = str_00.m_size;
          pQVar1 = QString::append(pQVar1,str);
          return (ssize_t)pQVar1;
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        pQVar1 = QString::append(pQVar1,str_00);
        return (ssize_t)pQVar1;
      }
      goto LAB_00356a83;
    }
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning(&local_28,"QXmlStreamWriter: No device");
  }
  else if ((this->field_0x78 & 0x20) == 0) {
    s_00.m_size = (ulong)__buf & 0x3fffffffffffffff;
    if (((ulong)__buf & 0xc000000000000000) == 0x4000000000000000) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        s.m_data = str_00.m_data;
        s.m_size = s_00.m_size;
        doWriteToDevice(this,s);
        return extraout_RAX;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      s_00.m_data = str_00.m_data;
      doWriteToDevice(this,s_00);
      return extraout_RAX_00;
    }
    goto LAB_00356a83;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
LAB_00356a83:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::write(QAnyStringView s)
{
    if (device) {
        if (hasIoError)
            return;

        s.visit([&] (auto s) { doWriteToDevice(s); });
    } else if (stringDevice) {
        s.visit([&] (auto s) { stringDevice->append(s); });
    } else {
        qWarning("QXmlStreamWriter: No device");
    }
}